

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Union(MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  bool bVar1;
  iterator iVar2;
  iterator __position;
  undefined8 in_RSI;
  WW<135UL> *in_RDI;
  iterator iter;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  _List_const_iterator<GF2::MM<135UL>_> local_40;
  list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *in_stack_ffffffffffffffd0;
  _Self local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  iVar2 = std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                    ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)in_RDI);
  __position = std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                         ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)in_RDI);
  local_18._M_node =
       (_List_node_base *)
       std::lower_bound<std::_List_iterator<GF2::MM<135ul>>,GF2::MM<135ul>,GF2::MOLex<135ul>>
                 (iVar2._M_node,__position._M_node,local_10);
  iVar2 = std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                    ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)in_RDI);
  bVar1 = std::operator==(&local_18,(_Self *)&stack0xffffffffffffffc8);
  uVar3 = true;
  if (!bVar1) {
    std::_List_iterator<GF2::MM<135UL>_>::operator*((_List_iterator<GF2::MM<135UL>_> *)0x17a3bc);
    uVar3 = WW<135ul>::operator!=((WW<135UL> *)CONCAT17(uVar3,in_stack_ffffffffffffffb0),in_RDI);
  }
  if ((bool)uVar3 != false) {
    std::_List_const_iterator<GF2::MM<135UL>_>::_List_const_iterator(&local_40,&local_18);
    std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::insert
              (in_stack_ffffffffffffffd0,(const_iterator)__position._M_node,
               (value_type *)iVar2._M_node);
  }
  return;
}

Assistant:

void Union(const MM<_n>& mRight)
	{	
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет mRight?
		if (iter == end() || *iter != mRight)
			insert(iter, mRight);
	}